

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O1

QList<QLoggingRule> *
loadRulesFromFile(QList<QLoggingRule> *__return_storage_ptr__,QString *filePath)

{
  int *piVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  int __oflag;
  char *pcVar5;
  long in_FS_OFFSET;
  QMessageLogger local_a8;
  QTextStream local_88;
  QFile local_78;
  QArrayDataPointer<QLoggingRule> local_60;
  QLoggingSettingsParser local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = qtLoggingDebug();
  if (bVar3) {
    local_48.m_inRulesSection = true;
    local_48._1_3_ = 0;
    local_48._4_4_ = 0;
    local_48._rules.d.d._0_4_ = 0;
    local_48._rules.d.d._4_4_ = 0;
    local_48._rules.d.ptr._0_4_ = 0;
    local_48._rules.d.ptr._4_4_ = 0;
    local_48._rules.d.size = 0x4dbc8b;
    QDir::toNativeSeparators(filePath);
    QString::toUtf8_helper((QByteArray *)&local_a8,(QString *)&local_60);
    pcVar5 = (char *)CONCAT44(local_a8.context.file._4_4_,local_a8.context.file._0_4_);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "";
    }
    QMessageLogger::debug((QMessageLogger *)&local_48,"Checking \"%s\" for rules",pcVar5);
    piVar1 = (int *)CONCAT44(local_a8.context.line,local_a8.context.version);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_a8.context.line,local_a8.context.version),1,0x10);
      }
    }
    if (&(local_60.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d)->super_QArrayData,2,0x10);
      }
    }
  }
  local_78.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_78.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_78,filePath);
  iVar4 = QFile::open(&local_78,(char *)0x11,__oflag);
  if ((char)iVar4 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QLoggingRule *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_88._vptr_QTextStream = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d_ptr._M_t.
    super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
    super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
         (__uniq_ptr_data<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>,_true,_true>)
         &DAT_aaaaaaaaaaaaaaaa;
    QTextStream::QTextStream(&local_88,(QIODevice *)&local_78);
    local_48._4_4_ = 0xaaaaaaaa;
    local_48.m_inRulesSection = false;
    local_48._1_3_ = 0xaaaaaa;
    local_48._rules.d.d._0_4_ = 0;
    local_48._rules.d.d._4_4_ = 0;
    local_48._rules.d.ptr._0_4_ = 0;
    local_48._rules.d.ptr._4_4_ = 0;
    local_48._rules.d.size = 0;
    QLoggingSettingsParser::setContent(&local_48,&local_88);
    bVar3 = qtLoggingDebug();
    if (bVar3) {
      local_a8.context.version = 2;
      local_a8.context.line = 0;
      local_a8.context.file._0_4_ = 0;
      local_a8.context.file._4_4_ = 0;
      local_a8.context.function._0_4_ = 0;
      local_a8.context.function._4_4_ = 0;
      local_a8.context.category = "qt.core.logging";
      local_60.d = (Data *)CONCAT44(local_48._rules.d.d._4_4_,local_48._rules.d.d._0_4_);
      local_60.ptr._0_4_ = local_48._rules.d.ptr._0_4_;
      local_60.ptr._4_4_ = local_48._rules.d.ptr._4_4_;
      local_60.size._0_4_ = (undefined4)local_48._rules.d.size;
      local_60.size._4_4_ = local_48._rules.d.size._4_4_;
      if ((QArrayData *)local_60.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_60.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_60.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QMessageLogger::debug(&local_a8,"Loaded %td rules",local_48._rules.d.size);
      QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_60);
    }
    pDVar2 = (Data *)CONCAT44(local_48._rules.d.d._4_4_,local_48._rules.d.d._0_4_);
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr =
         (QLoggingRule *)CONCAT44(local_48._rules.d.ptr._4_4_,local_48._rules.d.ptr._0_4_);
    (__return_storage_ptr__->d).size = local_48._rules.d.size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_48._rules.d);
    QTextStream::~QTextStream(&local_88);
  }
  QFile::~QFile(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QList<QLoggingRule> loadRulesFromFile(const QString &filePath)
{
    if (qtLoggingDebug()) {
        debugMsg("Checking \"%s\" for rules",
                 QDir::toNativeSeparators(filePath).toUtf8().constData());
    }

    QFile file(filePath);
    if (file.open(QIODevice::ReadOnly | QIODevice::Text)) {
        QTextStream stream(&file);
        QLoggingSettingsParser parser;
        parser.setContent(stream);
        if (qtLoggingDebug())
            debugMsg("Loaded %td rules", static_cast<ptrdiff_t>(parser.rules().size()));
        return parser.rules();
    }
    return QList<QLoggingRule>();
}